

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QUrl __thiscall QVariant::toUrl(QVariant *this)

{
  QUrl *pQVar1;
  bool bVar2;
  QUrl *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QUrl>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)((ulong)in_RSI[3].d & 0xfffffffffffffffc);
  bVar2 = ::comparesEqual(&local_28,&local_20);
  if (bVar2) {
    if (((ulong)in_RSI[3].d & 1) != 0) {
      in_RSI = (QUrl *)((long)&(in_RSI->d->ref).super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
                       + (long)in_RSI->d->port);
    }
    QUrl::QUrl((QUrl *)this,in_RSI);
  }
  else {
    (this->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl((QUrl *)this);
    pQVar1 = in_RSI + 3;
    if (((ulong)pQVar1->d & 1) != 0) {
      in_RSI = (QUrl *)((long)&(in_RSI->d->ref).super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
                       + (long)in_RSI->d->port);
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)pQVar1->d & 0xfffffffffffffffc),in_RSI,local_20
                       ,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QUrl)(QUrlPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QUrl QVariant::toUrl() const
{
    return qvariant_cast<QUrl>(*this);
}